

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

MQTT_DEVICE_TWIN_ITEM *
createDeviceTwinMsg(MQTTTRANSPORT_HANDLE_DATA *transport_data,
                   DEVICE_TWIN_MSG_TYPE device_twin_msg_type,uint32_t iothub_msg_id)

{
  undefined2 uVar1;
  uint16_t uVar2;
  int iVar3;
  tickcounter_ms_t in_RAX;
  LOGGER_LOG p_Var4;
  MQTT_DEVICE_TWIN_ITEM *pMVar5;
  char *pcVar6;
  tickcounter_ms_t current_time;
  tickcounter_ms_t local_28;
  
  local_28 = in_RAX;
  iVar3 = tickcounter_get_current_ms(transport_data->msgTickCounter,&local_28);
  if (iVar3 == 0) {
    pMVar5 = (MQTT_DEVICE_TWIN_ITEM *)calloc(1,0x50);
    if (pMVar5 != (MQTT_DEVICE_TWIN_ITEM *)0x0) {
      pMVar5->msgCreationTime = local_28;
      uVar1 = transport_data->packetId;
      uVar2 = 1;
      if ((ushort)uVar1 < 0xfffe) {
        uVar2 = uVar1 + 1;
      }
      transport_data->packetId = uVar2;
      pMVar5->packet_id = uVar2;
      pMVar5->iothub_msg_id = iothub_msg_id;
      pMVar5->device_twin_msg_type = device_twin_msg_type;
      return pMVar5;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (MQTT_DEVICE_TWIN_ITEM *)0x0;
    }
    pcVar6 = "Failed allocating device twin data.";
    iVar3 = 0x477;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (MQTT_DEVICE_TWIN_ITEM *)0x0;
    }
    pcVar6 = "Failed retrieving tickcounter info";
    iVar3 = 0x472;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
            ,"createDeviceTwinMsg",iVar3,1,pcVar6);
  return (MQTT_DEVICE_TWIN_ITEM *)0x0;
}

Assistant:

static MQTT_DEVICE_TWIN_ITEM* createDeviceTwinMsg(MQTTTRANSPORT_HANDLE_DATA* transport_data, DEVICE_TWIN_MSG_TYPE device_twin_msg_type, uint32_t iothub_msg_id)
{
    MQTT_DEVICE_TWIN_ITEM* result;
    tickcounter_ms_t current_time;

    if (tickcounter_get_current_ms(transport_data->msgTickCounter, &current_time) != 0)
    {
        LogError("Failed retrieving tickcounter info");
        result = NULL;
    }
    else if ((result = (MQTT_DEVICE_TWIN_ITEM*)malloc(sizeof(MQTT_DEVICE_TWIN_ITEM))) == NULL)
    {
        LogError("Failed allocating device twin data.");
        result = NULL;
    }
    else
    {
        memset(result, 0, sizeof(*result));
        result->msgCreationTime = current_time;
        result->packet_id = getNextPacketId(transport_data);
        result->iothub_msg_id = iothub_msg_id;
        result->device_twin_msg_type = device_twin_msg_type;
    }

    return result;
}